

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O1

char32_t __thiscall TextFile::readCharacter(TextFile *this)

{
  size_t sVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  unsigned_short SjisCharacter;
  ushort uVar5;
  optional<char16_t> oVar6;
  char32_t cVar7;
  size_t *psVar8;
  string *psVar9;
  string *psVar10;
  size_t *psVar11;
  char32_t cVar12;
  uint uVar13;
  uint uVar14;
  char *fmt;
  int iVar15;
  string local_70;
  size_t *local_50;
  string *local_48;
  TextFile *local_40;
  string *local_38;
  
  cVar12 = L'\0';
  switch(this->encoding) {
  case ASCII:
    if (this->fromMemory == true) {
      psVar9 = &this->content;
      psVar11 = &this->contentPos;
LAB_00150f6e:
      sVar1 = *psVar11;
      *psVar11 = sVar1 + 1;
      cVar12 = (char32_t)(byte)(psVar9->_M_dataplus)._M_p[sVar1];
    }
    else {
      if ((this->bufPos < (this->buf)._M_string_length) ||
         (bufFillRead(this), (this->buf)._M_string_length != 0)) {
        psVar9 = &this->buf;
        psVar11 = &this->bufPos;
        this->contentPos = this->contentPos + 1;
        goto LAB_00150f6e;
      }
      cVar12 = L'\0';
    }
    this->contentPos = this->contentPos + 1;
    goto switchD_00150c93_default;
  case UTF8:
    if (this->fromMemory == true) {
      psVar9 = &this->content;
      psVar11 = &this->contentPos;
LAB_00150fc6:
      sVar1 = *psVar11;
      *psVar11 = sVar1 + 1;
      bVar4 = (psVar9->_M_dataplus)._M_p[sVar1];
    }
    else {
      if ((this->bufPos < (this->buf)._M_string_length) ||
         (bufFillRead(this), (this->buf)._M_string_length != 0)) {
        psVar9 = &this->buf;
        psVar11 = &this->bufPos;
        this->contentPos = this->contentPos + 1;
        goto LAB_00150fc6;
      }
      bVar4 = 0;
    }
    cVar12 = (char32_t)bVar4;
    if ((cVar12 & 0xffffffe0U) == 0xc0) {
      cVar12 = cVar12 & 0x1f;
      iVar15 = 1;
LAB_00151005:
      bVar2 = true;
    }
    else {
      if ((cVar12 & 0xfffffff0U) == 0xe0) {
        cVar12 = cVar12 & 0xf;
        iVar15 = 2;
        goto LAB_00151005;
      }
      if ((char)bVar4 < '\0') {
        tinyformat::format<>(&local_70,"One or more invalid UTF-8 characters in this file");
        std::__cxx11::string::operator=((string *)&this->errorText,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      bVar2 = false;
      iVar15 = 0;
    }
    if (bVar2) {
      local_48 = &this->buf;
      local_50 = &this->bufPos;
      psVar9 = &this->content;
      psVar11 = &this->contentPos;
      local_38 = (string *)&this->errorText;
      iVar15 = iVar15 + (uint)(iVar15 == 0);
      local_40 = this;
      do {
        psVar8 = psVar11;
        psVar10 = psVar9;
        if (this->fromMemory == false) {
          if ((this->bufPos < (this->buf)._M_string_length) ||
             (bufFillRead(this), (this->buf)._M_string_length != 0)) {
            this->contentPos = this->contentPos + 1;
            psVar8 = local_50;
            psVar10 = local_48;
            goto LAB_001510de;
          }
          uVar14 = 0;
        }
        else {
LAB_001510de:
          sVar1 = *psVar8;
          *psVar8 = sVar1 + 1;
          uVar14 = (uint)(byte)(psVar10->_M_dataplus)._M_p[sVar1];
        }
        if ((uVar14 & 0xffffffc0) != 0x80) {
          tinyformat::format<>(&local_70,"One or more invalid UTF-8 characters in this file");
          std::__cxx11::string::operator=(local_38,(string *)&local_70);
          this = local_40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            this = local_40;
          }
        }
        cVar12 = cVar12 << 6 | uVar14 & 0x3f;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
    goto switchD_00150c93_default;
  case UTF16LE:
    if (this->fromMemory == true) {
      psVar9 = &this->content;
      psVar11 = &this->contentPos;
LAB_00150df6:
      sVar1 = *psVar11;
      *psVar11 = sVar1 + 1;
      uVar14 = (uint)(byte)(psVar9->_M_dataplus)._M_p[sVar1];
    }
    else {
      if ((this->bufPos < (this->buf)._M_string_length) ||
         (bufFillRead(this), (this->buf)._M_string_length != 0)) {
        psVar9 = &this->buf;
        psVar11 = &this->bufPos;
        this->contentPos = this->contentPos + 1;
        goto LAB_00150df6;
      }
      uVar14 = 0;
    }
    if (this->fromMemory == true) {
      psVar9 = &this->content;
      psVar11 = &this->contentPos;
LAB_00150e5c:
      sVar1 = *psVar11;
      *psVar11 = sVar1 + 1;
      uVar13 = (uint)(byte)(psVar9->_M_dataplus)._M_p[sVar1] << 8;
    }
    else {
      if ((this->bufPos < (this->buf)._M_string_length) ||
         (bufFillRead(this), (this->buf)._M_string_length != 0)) {
        psVar9 = &this->buf;
        psVar11 = &this->bufPos;
        this->contentPos = this->contentPos + 1;
        goto LAB_00150e5c;
      }
      uVar13 = 0;
    }
    cVar12 = uVar13 | uVar14;
    goto switchD_00150c93_default;
  case UTF16BE:
    if (this->fromMemory == true) {
      psVar9 = &this->content;
      psVar11 = &this->contentPos;
LAB_00150eb3:
      sVar1 = *psVar11;
      *psVar11 = sVar1 + 1;
      uVar14 = (uint)(byte)(psVar9->_M_dataplus)._M_p[sVar1] << 8;
    }
    else {
      if ((this->bufPos < (this->buf)._M_string_length) ||
         (bufFillRead(this), (this->buf)._M_string_length != 0)) {
        psVar9 = &this->buf;
        psVar11 = &this->bufPos;
        this->contentPos = this->contentPos + 1;
        goto LAB_00150eb3;
      }
      uVar14 = 0;
    }
    if (this->fromMemory == true) {
      psVar9 = &this->content;
      psVar11 = &this->contentPos;
LAB_00150f1b:
      sVar1 = *psVar11;
      *psVar11 = sVar1 + 1;
      uVar13 = (uint)(byte)(psVar9->_M_dataplus)._M_p[sVar1];
    }
    else {
      if ((this->bufPos < (this->buf)._M_string_length) ||
         (bufFillRead(this), (this->buf)._M_string_length != 0)) {
        psVar9 = &this->buf;
        psVar11 = &this->bufPos;
        this->contentPos = this->contentPos + 1;
        goto LAB_00150f1b;
      }
      uVar13 = 0;
    }
    cVar12 = uVar14 | uVar13;
    goto switchD_00150c93_default;
  case SJIS:
    if (this->fromMemory == true) {
      psVar9 = &this->content;
      psVar11 = &this->contentPos;
LAB_00150d78:
      sVar1 = *psVar11;
      *psVar11 = sVar1 + 1;
      bVar4 = (psVar9->_M_dataplus)._M_p[sVar1];
    }
    else {
      if ((this->bufPos < (this->buf)._M_string_length) ||
         (bufFillRead(this), (this->buf)._M_string_length != 0)) {
        psVar9 = &this->buf;
        psVar11 = &this->bufPos;
        this->contentPos = this->contentPos + 1;
        goto LAB_00150d78;
      }
      bVar4 = 0;
    }
    SjisCharacter = (unsigned_short)bVar4;
    if ((char)bVar4 < '\0') {
      if (this->fromMemory == true) {
        psVar9 = &this->content;
        psVar11 = &this->contentPos;
LAB_001511a3:
        sVar1 = *psVar11;
        *psVar11 = sVar1 + 1;
        uVar5 = (ushort)(byte)(psVar9->_M_dataplus)._M_p[sVar1];
      }
      else {
        if ((this->bufPos < (this->buf)._M_string_length) ||
           (bufFillRead(this), (this->buf)._M_string_length != 0)) {
          psVar9 = &this->buf;
          psVar11 = &this->bufPos;
          this->contentPos = this->contentPos + 1;
          goto LAB_001511a3;
        }
        uVar5 = 0;
      }
      SjisCharacter = uVar5 | (ushort)bVar4 << 8;
    }
    oVar6 = sjisToUnicode(SjisCharacter);
    if (((uint)oVar6.super__Optional_base<char16_t,_true,_true>._M_payload.
               super__Optional_payload_base<char16_t> >> 0x10 & 1) != 0) {
      cVar12 = (uint)oVar6.super__Optional_base<char16_t,_true,_true>._M_payload.
                     super__Optional_payload_base<char16_t> & 0xffff;
      goto switchD_00150c93_default;
    }
    fmt = "One or more invalid Shift-JIS characters in this file";
    break;
  case GUESS:
    fmt = "Cannot read from GUESS encoding";
    break;
  default:
    goto switchD_00150c93_default;
  }
  tinyformat::format<>(&local_70,fmt);
  std::__cxx11::string::operator=((string *)&this->errorText,(string *)&local_70);
  cVar12 = L'\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
switchD_00150c93_default:
  cVar7 = cVar12;
  if ((cVar12 == L'\r') && (this->recursion == false)) {
    cVar3 = '\x01';
    if (this->fromMemory == false) {
      cVar3 = std::__basic_file<char>::is_open();
    }
    if (((cVar3 == '\0') || (this->mode != Read)) || ((long)this->contentPos < this->size_)) {
      this->recursion = true;
      sVar1 = this->contentPos;
      cVar7 = readCharacter(this);
      this->recursion = false;
      if (cVar7 != L'\n') {
        if (this->fromMemory == true) {
          this->contentPos = sVar1;
          cVar7 = cVar12;
        }
        else {
          std::istream::seekg(this,sVar1,0);
          cVar7 = cVar12;
        }
      }
    }
  }
  return cVar7;
}

Assistant:

char32_t TextFile::readCharacter()
{
	char32_t value = 0;

	switch (encoding)
	{
	case UTF8:
		{
			value = bufGetChar();
			
			int extraBytes = 0;
			if ((value & 0xE0) == 0xC0)
			{
				extraBytes = 1;
				value &= 0x1F;
			} else if ((value & 0xF0) == 0xE0)
			{
				extraBytes = 2;
				value &= 0x0F;
			} else if (value > 0x7F)
			{
				errorText = tfm::format("One or more invalid UTF-8 characters in this file");
			}

			for (int i = 0; i < extraBytes; i++)
			{
				int b = bufGetChar();
				if ((b & 0xC0) != 0x80)
				{
					errorText = tfm::format("One or more invalid UTF-8 characters in this file");
				}

				value = (value << 6) | (b & 0x3F);
			}
		}
		break;
	case UTF16LE:
		value = bufGet16LE();
		break;
	case UTF16BE:
		value = bufGet16BE();
		break;
	case SJIS:
		{
			unsigned short sjis = bufGetChar();
			if (sjis >= 0x80)
				sjis = (sjis << 8) | bufGetChar();

			if (auto unicode = sjisToUnicode(sjis))
				value = *unicode;
			else
				errorText = tfm::format("One or more invalid Shift-JIS characters in this file");
		}
		break;
	case ASCII:
		value = bufGetChar();
		contentPos++;
		break;

	case GUESS:
		errorText = tfm::format("Cannot read from GUESS encoding");
		break;
	}

	// convert \r\n to \n
	if (value == L'\r' && !recursion && !atEnd())
	{
		recursion = true;
		long pos = tell();
		char32_t nextValue = readCharacter();
		recursion = false;

		if (nextValue == L'\n')
			return nextValue;
		seek(pos);
	}

	return value;
}